

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.c
# Opt level: O0

double getVariableValue(char *key)

{
  int iVar1;
  variable *local_20;
  variable *var;
  char *key_local;
  
  local_20 = variables_first;
  while( true ) {
    if (local_20 == (variable *)0x0) {
      return 0.0;
    }
    iVar1 = strcmp(key,local_20->key);
    if (iVar1 == 0) break;
    local_20 = local_20->next;
  }
  return local_20->value;
}

Assistant:

double getVariableValue(const char *key)
{
    struct variable *var = variables_first;

    while (var != NULL) {
        if (!strcmp(key, var->key)) {
            return var->value;
        }

        var = var->next;
    }

    return 0;
}